

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>::reallocateAndGrow
          (QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *old)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Changing *pCVar3;
  Data *pDVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Changing *data;
  long lVar8;
  undefined1 *puVar9;
  long lVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (Changing *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  if (local_48.ptr == (Changing *)0x0 && 0 < n) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      qBadAlloc();
    }
  }
  else {
    puVar9 = (undefined1 *)local_48.size;
    if (this->size != 0) {
      lVar8 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) ||
          (old != (QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QtPrivate::QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing>::copyAppend
                  ((QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing> *)&local_48,
                   this->ptr,this->ptr + lVar8);
        puVar9 = (undefined1 *)local_48.size;
      }
      else if (0 < lVar8) {
        pCVar3 = this->ptr;
        lVar10 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(pCVar3->parent).r + lVar10);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          uVar7 = *(undefined8 *)((long)puVar1 + 0x14);
          puVar2 = (undefined8 *)((long)&local_48.ptr[local_48.size].parent.i + lVar10 + 4);
          *puVar2 = *(undefined8 *)((long)puVar1 + 0xc);
          puVar2[1] = uVar7;
          puVar2 = (undefined8 *)((long)&local_48.ptr[local_48.size].parent.r + lVar10);
          *puVar2 = uVar5;
          puVar2[1] = uVar6;
          uVar5 = puVar1[4];
          uVar6 = puVar1[5];
          uVar7 = puVar1[7];
          puVar2 = (undefined8 *)((long)&local_48.ptr[local_48.size].last.d.data + lVar10 + 0x10);
          *puVar2 = puVar1[6];
          puVar2[1] = uVar7;
          puVar2 = (undefined8 *)((long)&local_48.ptr[local_48.size].last.d.data + lVar10);
          *puVar2 = uVar5;
          puVar2[1] = uVar6;
          puVar1[6] = 0;
          puVar1[4] = 0;
          puVar1[5] = 0;
          puVar1[7] = 2;
          uVar5 = puVar1[8];
          uVar6 = puVar1[9];
          uVar7 = puVar1[0xb];
          puVar2 = (undefined8 *)((long)&local_48.ptr[local_48.size].next.d.data + lVar10 + 0x10);
          *puVar2 = puVar1[10];
          puVar2[1] = uVar7;
          puVar2 = (undefined8 *)((long)&local_48.ptr[local_48.size].next.d.data + lVar10);
          *puVar2 = uVar5;
          puVar2[1] = uVar6;
          puVar1[10] = 0;
          puVar1[8] = 0;
          puVar1[9] = 0;
          puVar1[0xb] = 2;
          puVar9 = puVar9 + 1;
          lVar10 = lVar10 + 0x60;
        } while ((Changing *)(puVar1 + 0xc) < pCVar3 + lVar8);
      }
    }
    local_48.size = (qsizetype)puVar9;
    pDVar4 = this->d;
    this->d = local_48.d;
    pCVar3 = this->ptr;
    this->ptr = local_48.ptr;
    puVar9 = (undefined1 *)this->size;
    this->size = local_48.size;
    local_48.d = pDVar4;
    local_48.ptr = pCVar3;
    local_48.size = (qsizetype)puVar9;
    if (old != (QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar4;
      old->ptr = pCVar3;
      local_48.size = old->size;
      old->size = (qsizetype)puVar9;
    }
    ~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }